

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlGetLastChild(xmlNode *parent)

{
  xmlNode *parent_local;
  
  if ((parent == (xmlNode *)0x0) || (parent->type == XML_NAMESPACE_DECL)) {
    parent_local = (xmlNode *)0x0;
  }
  else {
    parent_local = parent->last;
  }
  return parent_local;
}

Assistant:

xmlNodePtr
xmlGetLastChild(const xmlNode *parent) {
    if ((parent == NULL) || (parent->type == XML_NAMESPACE_DECL)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlGetLastChild : parent == NULL\n");
#endif
	return(NULL);
    }
    return(parent->last);
}